

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O2

Array<asl::Array<asl::Var>_> __thiscall asl::TabularDataFile::data(TabularDataFile *this)

{
  bool bVar1;
  int in_ECX;
  void *__child_stack;
  TabularDataFile *in_RSI;
  void *in_R8;
  Array<asl::Var> AStack_28;
  
  Array<asl::Array<asl::Var>_>::Array((Array<asl::Array<asl::Var>_> *)this);
  while( true ) {
    bVar1 = nextRow(in_RSI);
    if (!bVar1) break;
    Array<asl::Var>::clone(&AStack_28,(__fn *)&in_RSI->_row,__child_stack,in_ECX,in_R8);
    Array<asl::Array<asl::Var>_>::operator<<((Array<asl::Array<asl::Var>_> *)this,&AStack_28);
    Array<asl::Var>::~Array(&AStack_28);
  }
  return (Array<asl::Array<asl::Var>_>)(Array<asl::Var> *)this;
}

Assistant:

Array<Array<Var> > TabularDataFile::data()
{
	Array<Array<Var> > data;

	while(nextRow())
	{
		data << _row.clone();
	}
	return data;
}